

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

double __thiscall mp::NLModel::ComputeObjValue(NLModel *this,double *x)

{
  size_t sVar1;
  int i;
  long lVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  double dVar7;
  
  dVar7 = this->obj_c0_;
  lVar2 = (long)(this->vars_).num_col_;
  lVar4 = lVar2;
  while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
    dVar7 = dVar7 + this->obj_c_[lVar4] * x[lVar4];
  }
  sVar1 = (this->Q_).num_nz_;
  if (sVar1 != 0) {
    while (sVar3 = sVar1, bVar6 = lVar2 != 0, lVar2 = lVar2 + -1, bVar6) {
      sVar1 = (this->Q_).start_[lVar2];
      for (sVar5 = sVar1; sVar3 != sVar5; sVar5 = sVar5 + 1) {
        dVar7 = dVar7 + (this->Q_).value_[sVar5] * 0.5 * x[lVar2] * x[(this->Q_).index_[sVar5]];
      }
    }
  }
  return dVar7;
}

Assistant:

double NLModel::ComputeObjValue(const double *x) const {
  double result {obj_c0_};
  for (auto i=NumCols(); i--; )
    result += obj_c_[i] * x[i];
  if (Q_.num_nz_) {
    auto pos_end = Q_.num_nz_;
    for (auto i=NumCols(); i--; ) {
      for (auto pos=Q_.start_[i]; pos!=pos_end; ++pos) {
        result
            += 0.5 * Q_.value_[pos] * x[i] * x[Q_.index_[pos]];
      }
      pos_end = Q_.start_[i];
    }
  }
  return result;
}